

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_parameter_validation.cpp
# Opt level: O2

ze_result_t __thiscall
validation_layer::ZEParameterValidation::zeVirtualMemSetAccessAttributePrologue
          (ZEParameterValidation *this,ze_context_handle_t hContext,void *ptr,size_t size,
          ze_memory_access_attribute_t access)

{
  ze_result_t zVar1;
  
  if (hContext == (ze_context_handle_t)0x0) {
    return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
  }
  if (ptr != (void *)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_ENUMERATION;
    if (((int)access < 3) && (zVar1 = ZE_RESULT_ERROR_UNSUPPORTED_SIZE, size != 0)) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_POINTER;
}

Assistant:

ze_result_t
    ZEParameterValidation::zeVirtualMemSetAccessAttributePrologue(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const void* ptr,                                ///< [in] pointer to start of reserved virtual address region.
        size_t size,                                    ///< [in] size in bytes; must be page aligned.
        ze_memory_access_attribute_t access             ///< [in] specifies page access attributes to apply to the virtual address
                                                        ///< range.
        )
    {
        if( nullptr == hContext )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == ptr )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( ZE_MEMORY_ACCESS_ATTRIBUTE_READONLY < access )
            return ZE_RESULT_ERROR_INVALID_ENUMERATION;

        if( 0 == size )
            return ZE_RESULT_ERROR_UNSUPPORTED_SIZE;

        return ZE_RESULT_SUCCESS;
    }